

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Armijo.cpp
# Opt level: O3

RealType __thiscall
QuantLib::ArmijoLineSearch::operator()
          (ArmijoLineSearch *this,Problem *P,Type *ecType,EndCriteria *endCriteria,RealType t_ini)

{
  DynamicVector<double,_std::allocator<double>_> *pDVar1;
  DynamicVector<double,_std::allocator<double>_> *pDVar2;
  DynamicVector<double,_std::allocator<double>_> *direction;
  double dVar3;
  pointer pdVar4;
  pointer pdVar5;
  RealType RVar6;
  bool bVar7;
  size_t iteration;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  uint uVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double dVar10;
  double local_88;
  allocator_type local_79;
  DynamicVector<double,_std::allocator<double>_> *local_78;
  RealType local_70;
  Constraint *local_68;
  double local_60;
  Type *local_58;
  EndCriteria *local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  local_68 = P->constraint_;
  (this->super_LineSearch).succeed_ = true;
  local_70 = P->functionValue_;
  uVar8 = SUB84(P->squaredNorm_,0);
  uVar9 = (uint)((ulong)P->squaredNorm_ >> 0x20);
  (this->super_LineSearch).qt_ = local_70;
  pDVar1 = &(this->super_LineSearch).gradient_;
  local_58 = ecType;
  local_50 = endCriteria;
  if ((this->super_LineSearch).gradient_.data_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->super_LineSearch).gradient_.data_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    RVar6 = Problem::DotProduct(P,pDVar1,&(this->super_LineSearch).searchDirection_);
    uVar8 = SUB84(RVar6,0);
    uVar9 = (uint)((ulong)RVar6 >> 0x20) ^ 0x80000000;
  }
  (this->super_LineSearch).qpt_ = (RealType)CONCAT44(uVar9,uVar8);
  pDVar2 = &P->currentValue_;
  local_78 = pDVar1;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_48,
             (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,&local_79);
  pdVar4 = (this->super_LineSearch).gradient_.data_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar5 = (this->super_LineSearch).gradient_.data_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  (this->super_LineSearch).gradient_.data_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (this->super_LineSearch).gradient_.data_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (this->super_LineSearch).gradient_.data_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((pdVar4 != (pointer)0x0) &&
     (operator_delete(pdVar4,(long)pdVar5 - (long)pdVar4),
     local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start != (pointer)0x0)) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pDVar1 = &(this->super_LineSearch).xtd_;
  std::vector<double,_std::allocator<double>_>::operator=(&pDVar1->data_,&pDVar2->data_);
  direction = &(this->super_LineSearch).searchDirection_;
  local_88 = LineSearch::update(&this->super_LineSearch,pDVar1,direction,t_ini,local_68);
  P->functionEvaluation_ = P->functionEvaluation_ + 1;
  (*P->objectiveFunction_->_vptr_ObjectiveFunction[2])(P->objectiveFunction_,pDVar1);
  P->functionValue_ = (RealType)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  (*P->statusFunction_->_vptr_StatusFunction[2])
            (P->statusFunction_,(ulong)(uint)P->functionEvaluation_,
             (ulong)(uint)P->gradientEvaluation_,pDVar2);
  dVar3 = P->functionValue_;
  (this->super_LineSearch).qt_ = dVar3;
  if (dVar3 - local_70 <= -this->alpha_ * local_88 * (this->super_LineSearch).qpt_) {
LAB_0020495b:
    pDVar2 = local_78;
    P->gradientEvaluation_ = P->gradientEvaluation_ + 1;
    (*P->objectiveFunction_->_vptr_ObjectiveFunction[3])(P->objectiveFunction_,local_78,pDVar1);
    RVar6 = Problem::DotProduct(P,pDVar2,pDVar2);
    (this->super_LineSearch).qpt_ = RVar6;
    return local_88;
  }
  iteration = 1;
  local_60 = dVar3;
LAB_00204861:
  dVar3 = this->beta_;
  std::vector<double,_std::allocator<double>_>::operator=(&pDVar1->data_,&pDVar2->data_);
  local_88 = LineSearch::update(&this->super_LineSearch,pDVar1,direction,local_88 * dVar3,local_68);
  P->functionEvaluation_ = P->functionEvaluation_ + 1;
  (*P->objectiveFunction_->_vptr_ObjectiveFunction[2])(P->objectiveFunction_,pDVar1);
  P->functionValue_ = (RealType)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
  (*P->statusFunction_->_vptr_StatusFunction[2])
            (P->statusFunction_,(ulong)(uint)P->functionEvaluation_,
             (ulong)(uint)P->gradientEvaluation_,pDVar2);
  (this->super_LineSearch).qt_ = P->functionValue_;
  P->gradientEvaluation_ = P->gradientEvaluation_ + 1;
  (*P->objectiveFunction_->_vptr_ObjectiveFunction[3])(P->objectiveFunction_,local_78,pDVar1);
  bVar7 = EndCriteria::checkMaxIterations(local_50,iteration,local_58);
  dVar3 = (this->super_LineSearch).qt_;
  dVar10 = -this->alpha_ * local_88 * (this->super_LineSearch).qpt_;
  if (dVar3 - local_70 <= dVar10) {
    if (dVar10 / this->beta_ < local_60 - local_70 || bVar7) {
      if (!bVar7) goto LAB_0020495b;
LAB_00204957:
      (this->super_LineSearch).succeed_ = false;
      goto LAB_0020495b;
    }
  }
  else if (bVar7) goto LAB_00204957;
  iteration = iteration + 1;
  local_60 = dVar3;
  goto LAB_00204861;
}

Assistant:

RealType ArmijoLineSearch::operator()(Problem& P, EndCriteria::Type& ecType,
                                        const EndCriteria& endCriteria,
                                        const RealType t_ini) {
    // OptimizationMethod& method = P.method();
    Constraint& constraint = P.constraint();
    succeed_               = true;
    bool maxIter           = false;
    RealType qtold, t = t_ini;
    size_t loopNumber = 0;

    RealType q0  = P.functionValue();
    RealType qp0 = P.gradientNormValue();

    qt_ = q0;
    qpt_ =
        (gradient_.empty()) ? qp0 : -P.DotProduct(gradient_, searchDirection_);

    // Initialize gradient
    gradient_ = DynamicVector<RealType>(P.currentValue().size());
    // Compute new point
    xtd_ = P.currentValue();
    t    = update(xtd_, searchDirection_, t, constraint);
    // Compute function value at the new point
    qt_ = P.value(xtd_);

    // Enter in the loop if the criterion is not satisfied
    if ((qt_ - q0) > -alpha_ * t * qpt_) {
      do {
        loopNumber++;
        // Decrease step
        t *= beta_;
        // Store old value of the function
        qtold = qt_;
        // New point value
        xtd_ = P.currentValue();
        t    = update(xtd_, searchDirection_, t, constraint);

        // Compute function value at the new point
        qt_ = P.value(xtd_);
        P.gradient(gradient_, xtd_);
        // and it squared norm
        maxIter = endCriteria.checkMaxIterations(loopNumber, ecType);
      } while ((((qt_ - q0) > (-alpha_ * t * qpt_)) ||
                ((qtold - q0) <= (-alpha_ * t * qpt_ / beta_))) &&
               (!maxIter));
    }

    if (maxIter) succeed_ = false;

    // Compute new gradient
    P.gradient(gradient_, xtd_);
    // and it squared norm
    // qpt_ = P.computeGradientNormValue(gradient_);
    qpt_ = P.DotProduct(gradient_, gradient_);

    // Return new step value
    return t;
  }